

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::
constView<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<int,false,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          bit,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              sit,View<int,_true,_std::allocator<unsigned_long>_> *out)

{
  runtime_error *this_00;
  size_t offset;
  allocator_type local_29;
  size_t local_28;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  local_28 = 0;
  coordinatesToOffset<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (this,bit,&local_28);
  if (*(long *)this != 0) {
    View<int,true,std::allocator<unsigned_long>>::
    assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_const*>
              ((View<int,true,std::allocator<unsigned_long>> *)out,sit,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(sit._M_current + *(long *)(this + 0x28)),*(unsigned_long **)(this + 0x20),
               (pointer)(*(long *)this + local_28 * 4),(CoordinateOrder *)(this + 0x38),&local_29);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
View<T, isConst, A>::constView
(
    BaseIterator bit,
    ShapeIterator sit,
    View<T, true, A>& out
) const
{
    constView(bit, sit, coordinateOrder(), out);
}